

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSpatialAnchorCreateInfoHTC *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *pXVar5;
  XrSpatialAnchorCreateInfoHTC *in_stack_fffffffffffffd08;
  allocator local_2e9;
  string poseinspace_prefix;
  string name_prefix;
  string type_prefix;
  string space_prefix;
  string next_prefix;
  undefined1 local_248 [32];
  string local_228;
  undefined1 local_208 [32];
  string local_1e8;
  string local_1c8;
  ostringstream oss_space;
  uint auStack_190 [2];
  PFN_xrCreateSwapchain local_188;
  PFN_xrCreateActionSpace p_Stack_180;
  PFN_xrLocateSpace local_178;
  PFN_xrAcquireSwapchainImage p_Stack_170;
  
  PointerToHexString<XrSpatialAnchorCreateInfoHTC>(in_stack_fffffffffffffd08);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
  std::__cxx11::string::~string((string *)&oss_space);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_space,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
    std::__cxx11::string::~string((string *)&oss_space);
  }
  else {
    local_178 = (PFN_xrLocateSpace)0x0;
    p_Stack_170 = (PFN_xrAcquireSwapchainImage)0x0;
    local_188 = (PFN_xrCreateSwapchain)0x0;
    p_Stack_180 = (PFN_xrCreateActionSpace)0x0;
    auStack_190[0] = 0;
    auStack_190[1] = 0;
    _oss_space = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_space);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,(char (*) [64])&oss_space);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_1c8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_1c8,contents);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&space_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&space_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_space);
  *(uint *)((long)auStack_190 + *(long *)(_oss_space + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_oss_space + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_space);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&space_prefix,&poseinspace_prefix);
  std::__cxx11::string::~string((string *)&poseinspace_prefix);
  std::__cxx11::string::string((string *)&poseinspace_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&poseinspace_prefix);
  std::__cxx11::string::string((string *)(local_208 + 0x20),(string *)&poseinspace_prefix);
  pXVar5 = (XrGeneratedDispatchTable *)local_208;
  std::__cxx11::string::string((string *)pXVar5,"XrPosef",(allocator *)&name_prefix);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar5,&value->poseInSpace,(string *)(local_208 + 0x20),(string *)local_208,
                     false,contents);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)(local_208 + 0x20));
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&name_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&name_prefix);
  std::__cxx11::string::string((string *)(local_248 + 0x20),(string *)&name_prefix);
  pXVar5 = (XrGeneratedDispatchTable *)local_248;
  std::__cxx11::string::string((string *)pXVar5,"XrSpatialAnchorNameHTC",&local_2e9);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar5,&value->name,(string *)(local_248 + 0x20),(string *)local_248,false,
                     contents);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)(local_248 + 0x20));
  if (bVar2) {
    std::__cxx11::string::~string((string *)&name_prefix);
    std::__cxx11::string::~string((string *)&poseinspace_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_space);
    std::__cxx11::string::~string((string *)&space_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialAnchorCreateInfoHTC* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string space_prefix = prefix;
        space_prefix += "space";
        std::ostringstream oss_space;
        oss_space << std::hex << reinterpret_cast<const void*>(value->space);
        contents.emplace_back("XrSpace", space_prefix, oss_space.str());
        std::string poseinspace_prefix = prefix;
        poseinspace_prefix += "poseInSpace";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->poseInSpace, poseinspace_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string name_prefix = prefix;
        name_prefix += "name";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->name, name_prefix, "XrSpatialAnchorNameHTC", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}